

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O1

MPI_Comm __thiscall henson::ProcMap::intracomm(ProcMap *this,string *to)

{
  long lVar1;
  long lVar2;
  iterator iVar3;
  runtime_error *this_00;
  long lVar4;
  _Base_ptr unaff_RBX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = *(long *)(this + 8);
  do {
    lVar4 = lVar2;
    lVar1 = *(long *)this;
    if (lVar4 == lVar1) break;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                    *)(lVar4 + -0x30),to);
    if ((_Base_ptr)(lVar4 + -0x28) != iVar3._M_node) {
      unaff_RBX = iVar3._M_node[2]._M_parent;
    }
    lVar2 = lVar4 + -0x98;
  } while ((_Base_ptr)(lVar4 + -0x28) == iVar3._M_node);
  if (lVar4 != lVar1) {
    return (MPI_Comm)unaff_RBX;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"No intracomm associated with ",to);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MPI_Comm    intracomm(const std::string& to)
        {
            // Search for the intracomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.intra_comm;
            }
            throw std::runtime_error("No intracomm associated with " + to);
        }